

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O1

UByteArray * __thiscall
TreeModel::header(UByteArray *__return_storage_ptr__,TreeModel *this,UModelIndex *index)

{
  uint64_t uVar1;
  long lVar2;
  
  if (((index->r < 0) || (index->c < 0)) || (index->m == (TreeModel *)0x0)) {
    (__return_storage_ptr__->d)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->d).field_2;
    (__return_storage_ptr__->d)._M_string_length = 0;
    (__return_storage_ptr__->d).field_2._M_local_buf[0] = '\0';
  }
  else {
    uVar1 = index->i;
    (__return_storage_ptr__->d)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->d).field_2;
    lVar2 = *(long *)(uVar1 + 0x68);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,*(long *)(uVar1 + 0x70) + lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

UByteArray TreeModel::header(const UModelIndex &index) const
{
    if (!index.isValid())
        return UByteArray();
    TreeItem *item = static_cast<TreeItem*>(index.internalPointer());
    return item->header();
}